

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O1

int ARKodeRootInit(void *arkode_mem,int nrtfn,ARKRootFn g)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  undefined8 *puVar5;
  long lVar6;
  void *__ptr;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  int error_code;
  char *msgfmt;
  size_t sVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar17 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar4 = 0x31;
    goto LAB_0015d5b3;
  }
  uVar3 = 0;
  if (0 < nrtfn) {
    if (*(long *)((long)arkode_mem + 0x98) == 0) {
      msgfmt = 
      "Time-stepping module missing fullrhs routine (required by requested solver configuration).";
      iVar17 = -0x16;
      error_code = -0x16;
      iVar4 = 0x3d;
      goto LAB_0015d5b3;
    }
    iVar4 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x250),
                        (N_Vector *)((long)arkode_mem + 600));
    uVar3 = nrtfn;
    if (iVar4 == 0) {
      msgfmt = "A memory request failed.";
      iVar17 = -0x14;
      error_code = -0x14;
      iVar4 = 0x44;
      goto LAB_0015d5b3;
    }
  }
  if (*(long *)((long)arkode_mem + 0x3d8) == 0) {
    puVar5 = (undefined8 *)malloc(0x88);
    *(undefined8 **)((long)arkode_mem + 0x3d8) = puVar5;
    if (puVar5 == (undefined8 *)0x0) {
      arkProcessError((ARKodeMem)arkode_mem,0,0x50,"ARKodeRootInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                      ,"Allocation of arkode_mem failed.");
      return -0x14;
    }
    *puVar5 = 0;
    *(undefined4 *)(puVar5 + 1) = 0;
    *(undefined4 *)((long)puVar5 + 100) = 0;
    puVar5[0xe] = 0;
    puVar5[2] = 0;
    puVar5[3] = 0;
    puVar5[7] = 0;
    puVar5[8] = 0;
    puVar5[9] = 0;
    *(undefined4 *)(puVar5 + 0xf) = 1;
    puVar5[0x10] = *(undefined8 *)((long)arkode_mem + 0x10);
    *(long *)((long)arkode_mem + 0x368) = *(long *)((long)arkode_mem + 0x368) + 5;
    *(long *)((long)arkode_mem + 0x370) = *(long *)((long)arkode_mem + 0x370) + 0xc;
  }
  uVar1 = *(uint *)(*(long *)((long)arkode_mem + 0x3d8) + 8);
  if (0 < (int)uVar1 && uVar3 != uVar1) {
    free(*(void **)(*(long *)((long)arkode_mem + 0x3d8) + 0x38));
    lVar11 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar11 + 0x38) = 0;
    free(*(void **)(lVar11 + 0x40));
    lVar11 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar11 + 0x40) = 0;
    free(*(void **)(lVar11 + 0x48));
    lVar11 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar11 + 0x48) = 0;
    free(*(void **)(lVar11 + 0x10));
    lVar11 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar11 + 0x10) = 0;
    free(*(void **)(lVar11 + 0x18));
    lVar11 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar11 + 0x18) = 0;
    free(*(void **)(lVar11 + 0x70));
    lVar11 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar11 + 0x70) = 0;
    lVar6 = (long)*(int *)(lVar11 + 8);
    lVar11 = lVar6 * 3;
    auVar13._8_4_ = (int)lVar11;
    auVar13._0_8_ = lVar11;
    auVar13._12_4_ = (int)((ulong)lVar11 >> 0x20);
    *(long *)((long)arkode_mem + 0x368) = *(long *)((long)arkode_mem + 0x368) + lVar6 * -3;
    *(long *)((long)arkode_mem + 0x370) = *(long *)((long)arkode_mem + 0x370) - auVar13._8_8_;
  }
  plVar2 = *(long **)((long)arkode_mem + 0x3d8);
  if (nrtfn < 1) {
    *(undefined4 *)(plVar2 + 1) = 0;
    *plVar2 = 0;
    return 0;
  }
  if (uVar3 == *(uint *)(plVar2 + 1)) {
    if ((ARKRootFn)*plVar2 == g) {
      return 0;
    }
    if (g != (ARKRootFn)0x0) {
      *plVar2 = (long)g;
      return 0;
    }
    free((void *)plVar2[7]);
    lVar11 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar11 + 0x38) = 0;
    free(*(void **)(lVar11 + 0x40));
    lVar11 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar11 + 0x40) = 0;
    free(*(void **)(lVar11 + 0x48));
    lVar11 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar11 + 0x48) = 0;
    free(*(void **)(lVar11 + 0x10));
    lVar11 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar11 + 0x10) = 0;
    free(*(void **)(lVar11 + 0x18));
    lVar11 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar11 + 0x18) = 0;
    free(*(void **)(lVar11 + 0x70));
    *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x70) = 0;
    *(ulong *)((long)arkode_mem + 0x368) = *(long *)((long)arkode_mem + 0x368) - (ulong)(uVar3 * 3);
    *(ulong *)((long)arkode_mem + 0x370) = *(long *)((long)arkode_mem + 0x370) - (ulong)(uVar3 * 3);
    msgfmt = "g = NULL illegal.";
    iVar17 = -0x16;
    error_code = -0x16;
    iVar4 = 0x9e;
  }
  else {
    *(uint *)(plVar2 + 1) = uVar3;
    if (g == (ARKRootFn)0x0) {
      msgfmt = "g = NULL illegal.";
      iVar17 = -0x16;
      error_code = -0x16;
      iVar4 = 0xaf;
    }
    else {
      *plVar2 = (long)g;
      plVar2[7] = 0;
      sVar10 = (ulong)uVar3 * 8;
      __ptr = malloc(sVar10);
      plVar2[7] = (long)__ptr;
      if (__ptr == (void *)0x0) {
        msgfmt = "A memory request failed.";
        iVar17 = -0x14;
        error_code = -0x14;
        iVar4 = 0xba;
      }
      else {
        plVar2[8] = 0;
        pvVar7 = malloc(sVar10);
        plVar2[8] = (long)pvVar7;
        if (pvVar7 == (void *)0x0) {
          free(__ptr);
          plVar2[7] = 0;
          msgfmt = "A memory request failed.";
          iVar17 = -0x14;
          error_code = -0x14;
          iVar4 = 0xc4;
        }
        else {
          plVar2[9] = 0;
          pvVar7 = malloc(sVar10);
          plVar2[9] = (long)pvVar7;
          if (pvVar7 == (void *)0x0) {
            free(__ptr);
            plVar2[7] = 0;
            free((void *)plVar2[8]);
            *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x40) = 0;
            msgfmt = "A memory request failed.";
            iVar17 = -0x14;
            error_code = -0x14;
            iVar4 = 0xd0;
          }
          else {
            plVar2[2] = 0;
            sVar10 = (ulong)uVar3 << 2;
            pvVar7 = malloc(sVar10);
            plVar2[2] = (long)pvVar7;
            if (pvVar7 == (void *)0x0) {
              free(__ptr);
              plVar2[7] = 0;
              free((void *)plVar2[8]);
              lVar11 = *(long *)((long)arkode_mem + 0x3d8);
              *(undefined8 *)(lVar11 + 0x40) = 0;
              free(*(void **)(lVar11 + 0x48));
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x48) = 0;
              msgfmt = "A memory request failed.";
              iVar17 = -0x14;
              error_code = -0x14;
              iVar4 = 0xde;
            }
            else {
              plVar2[3] = 0;
              pvVar7 = malloc(sVar10);
              plVar2[3] = (long)pvVar7;
              if (pvVar7 == (void *)0x0) {
                free(__ptr);
                plVar2[7] = 0;
                free((void *)plVar2[8]);
                lVar11 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar11 + 0x40) = 0;
                free(*(void **)(lVar11 + 0x48));
                lVar11 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar11 + 0x48) = 0;
                free(*(void **)(lVar11 + 0x10));
                *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x10) = 0;
                msgfmt = "A memory request failed.";
                iVar17 = -0x14;
                error_code = -0x14;
                iVar4 = 0xee;
              }
              else {
                plVar2[0xe] = 0;
                pvVar8 = malloc(sVar10);
                plVar2[0xe] = (long)pvVar8;
                if (pvVar8 != (void *)0x0) {
                  lVar11 = 0;
                  memset(pvVar7,0,(ulong)(uint)nrtfn << 2);
                  auVar13 = _DAT_001833d0;
                  uVar9 = 1;
                  if (1 < nrtfn) {
                    uVar9 = (ulong)(uint)nrtfn;
                  }
                  lVar6 = uVar9 - 1;
                  auVar12._8_4_ = (int)lVar6;
                  auVar12._0_8_ = lVar6;
                  auVar12._12_4_ = (int)((ulong)lVar6 >> 0x20);
                  auVar12 = auVar12 ^ _DAT_001833d0;
                  auVar14 = _DAT_001833b0;
                  auVar15 = _DAT_001833c0;
                  do {
                    auVar16 = auVar15 ^ auVar13;
                    iVar4 = auVar12._4_4_;
                    if ((bool)(~(auVar16._4_4_ == iVar4 && auVar12._0_4_ < auVar16._0_4_ ||
                                iVar4 < auVar16._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar8 + lVar11) = 1;
                    }
                    if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
                        auVar16._12_4_ <= auVar12._12_4_) {
                      *(undefined4 *)((long)pvVar8 + lVar11 + 4) = 1;
                    }
                    auVar16 = auVar14 ^ auVar13;
                    iVar17 = auVar16._4_4_;
                    if (iVar17 <= iVar4 && (iVar17 != iVar4 || auVar16._0_4_ <= auVar12._0_4_)) {
                      *(undefined4 *)((long)pvVar8 + lVar11 + 8) = 1;
                      *(undefined4 *)((long)pvVar8 + lVar11 + 0xc) = 1;
                    }
                    lVar6 = auVar15._8_8_;
                    auVar15._0_8_ = auVar15._0_8_ + 4;
                    auVar15._8_8_ = lVar6 + 4;
                    lVar6 = auVar14._8_8_;
                    auVar14._0_8_ = auVar14._0_8_ + 4;
                    auVar14._8_8_ = lVar6 + 4;
                    lVar11 = lVar11 + 0x10;
                  } while ((ulong)((int)uVar9 + 3U & 0xfffffffc) << 2 != lVar11);
                  *(ulong *)((long)arkode_mem + 0x368) =
                       (ulong)(uVar3 * 3) + *(long *)((long)arkode_mem + 0x368);
                  *(ulong *)((long)arkode_mem + 0x370) =
                       (ulong)(uVar3 * 3) + *(long *)((long)arkode_mem + 0x370);
                  return 0;
                }
                free(__ptr);
                plVar2[7] = 0;
                free((void *)plVar2[8]);
                lVar11 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar11 + 0x40) = 0;
                free(*(void **)(lVar11 + 0x48));
                lVar11 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar11 + 0x48) = 0;
                free(*(void **)(lVar11 + 0x10));
                lVar11 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar11 + 0x10) = 0;
                free(*(void **)(lVar11 + 0x18));
                *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x18) = 0;
                msgfmt = "A memory request failed.";
                iVar17 = -0x14;
                error_code = -0x14;
                iVar4 = 0x101;
              }
            }
          }
        }
      }
    }
  }
LAB_0015d5b3:
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar4,"ARKodeRootInit",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                  ,msgfmt);
  return iVar17;
}

Assistant:

int ARKodeRootInit(void* arkode_mem, int nrtfn, ARKRootFn g)
{
  int i, nrt;

  /* unpack ark_mem */
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  nrt     = (nrtfn < 0) ? 0 : nrtfn;

  /* Ensure that stepper provides fullrhs function */
  if (nrt > 0)
  {
    if (!(ark_mem->step_fullrhs))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_MISSING_FULLRHS);
      return ARK_ILL_INPUT;
    }

    if (!arkAllocVec(ark_mem, ark_mem->yn, &ark_mem->fn))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_MEM_FAIL);
      return (ARK_MEM_FAIL);
    }
  }

  /* If unallocated, allocate rootfinding structure, set defaults, update space */
  if (ark_mem->root_mem == NULL)
  {
    ark_mem->root_mem = (ARKodeRootMem)malloc(sizeof(struct ARKodeRootMemRec));
    if (ark_mem->root_mem == NULL)
    {
      arkProcessError(ark_mem, 0, __LINE__, __func__, __FILE__,
                      MSG_ARK_ARKMEM_FAIL);
      return (ARK_MEM_FAIL);
    }
    ark_mem->root_mem->glo       = NULL;
    ark_mem->root_mem->ghi       = NULL;
    ark_mem->root_mem->grout     = NULL;
    ark_mem->root_mem->iroots    = NULL;
    ark_mem->root_mem->rootdir   = NULL;
    ark_mem->root_mem->gfun      = NULL;
    ark_mem->root_mem->nrtfn     = 0;
    ark_mem->root_mem->irfnd     = 0;
    ark_mem->root_mem->gactive   = NULL;
    ark_mem->root_mem->mxgnull   = 1;
    ark_mem->root_mem->root_data = ark_mem->user_data;

    ark_mem->lrw += ARK_ROOT_LRW;
    ark_mem->liw += ARK_ROOT_LIW;
  }

  /* If rerunning ARKodeRootInit() with a different number of root
     functions (changing number of gfun components), then free
     currently held memory resources */
  if ((nrt != ark_mem->root_mem->nrtfn) && (ark_mem->root_mem->nrtfn > 0))
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots);
    ark_mem->root_mem->iroots = NULL;
    free(ark_mem->root_mem->rootdir);
    ark_mem->root_mem->rootdir = NULL;
    free(ark_mem->root_mem->gactive);
    ark_mem->root_mem->gactive = NULL;

    ark_mem->lrw -= 3 * (ark_mem->root_mem->nrtfn);
    ark_mem->liw -= 3 * (ark_mem->root_mem->nrtfn);
  }

  /* If ARKodeRootInit() was called with nrtfn == 0, then set
     nrtfn to zero and gfun to NULL before returning */
  if (nrt == 0)
  {
    ark_mem->root_mem->nrtfn = nrt;
    ark_mem->root_mem->gfun  = NULL;
    return (ARK_SUCCESS);
  }

  /* If rerunning ARKodeRootInit() with the same number of root
     functions (not changing number of gfun components), then
     check if the root function argument has changed */
  /* If g != NULL then return as currently reserved memory
     resources will suffice */
  if (nrt == ark_mem->root_mem->nrtfn)
  {
    if (g != ark_mem->root_mem->gfun)
    {
      if (g == NULL)
      {
        free(ark_mem->root_mem->glo);
        ark_mem->root_mem->glo = NULL;
        free(ark_mem->root_mem->ghi);
        ark_mem->root_mem->ghi = NULL;
        free(ark_mem->root_mem->grout);
        ark_mem->root_mem->grout = NULL;
        free(ark_mem->root_mem->iroots);
        ark_mem->root_mem->iroots = NULL;
        free(ark_mem->root_mem->rootdir);
        ark_mem->root_mem->rootdir = NULL;
        free(ark_mem->root_mem->gactive);
        ark_mem->root_mem->gactive = NULL;

        ark_mem->lrw -= 3 * nrt;
        ark_mem->liw -= 3 * nrt;

        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ARK_NULL_G);
        return (ARK_ILL_INPUT);
      }
      else
      {
        ark_mem->root_mem->gfun = g;
        return (ARK_SUCCESS);
      }
    }
    else { return (ARK_SUCCESS); }
  }

  /* Set variable values in ARKODE memory block */
  ark_mem->root_mem->nrtfn = nrt;
  if (g == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_G);
    return (ARK_ILL_INPUT);
  }
  else { ark_mem->root_mem->gfun = g; }

  /* Allocate necessary memory and return */
  ark_mem->root_mem->glo = NULL;
  ark_mem->root_mem->glo = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (ark_mem->root_mem->glo == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->ghi = NULL;
  ark_mem->root_mem->ghi = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (ark_mem->root_mem->ghi == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->grout = NULL;
  ark_mem->root_mem->grout = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (ark_mem->root_mem->grout == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->iroots = NULL;
  ark_mem->root_mem->iroots = (int*)malloc(nrt * sizeof(int));
  if (ark_mem->root_mem->iroots == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->rootdir = NULL;
  ark_mem->root_mem->rootdir = (int*)malloc(nrt * sizeof(int));
  if (ark_mem->root_mem->rootdir == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots);
    ark_mem->root_mem->iroots = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->gactive = NULL;
  ark_mem->root_mem->gactive =
    (sunbooleantype*)malloc(nrt * sizeof(sunbooleantype));
  if (ark_mem->root_mem->gactive == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots);
    ark_mem->root_mem->iroots = NULL;
    free(ark_mem->root_mem->rootdir);
    ark_mem->root_mem->rootdir = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }

  /* Set default values for rootdir (both directions) */
  for (i = 0; i < nrt; i++) { ark_mem->root_mem->rootdir[i] = 0; }

  /* Set default values for gactive (all active) */
  for (i = 0; i < nrt; i++) { ark_mem->root_mem->gactive[i] = SUNTRUE; }

  ark_mem->lrw += 3 * nrt;
  ark_mem->liw += 3 * nrt;

  return (ARK_SUCCESS);
}